

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id_unix.h
# Opt level: O2

bool CpuInformation::isSseSupported(void)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  piVar1 = (int *)cpuid_basic_info(0);
  if (0 < *piVar1) {
    lVar2 = cpuid_Version_info(1);
    bVar3 = (bool)((byte)((uint)*(undefined4 *)(lVar2 + 8) >> 0x1a) & 1);
  }
  return bVar3;
}

Assistant:

static bool isSseSupported()
    {
#ifndef __arm__
        int info[4];
        __cpuid_count( 0, 0, info[0], info[1], info[2], info[3] );
        const int id = info[0];

        if( id >= 0x00000001 ) {
            __cpuid_count( 0x00000001, 0, info[0], info[1], info[2], info[3] );
            return (info[3] & ((int)1 << 26)) != 0;
        }
#endif
        return false;
    }